

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O0

void __thiscall QGraphicsWidgetPrivate::~QGraphicsWidgetPrivate(QGraphicsWidgetPrivate *this)

{
  QGraphicsItemPrivate *in_RDI;
  
  (((__uniq_ptr_data<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>,_true,_true>
     *)&in_RDI->_vptr_QGraphicsItemPrivate)->
  super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
  )._M_t.
  super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
  .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl =
       (WindowData *)&PTR__QGraphicsWidgetPrivate_00d35e98;
  QList<QAction_*>::~QList((QList<QAction_*> *)0xa562a1);
  std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::~unique_ptr
            ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)in_RDI);
  std::
  unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
  ::~unique_ptr((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                 *)in_RDI);
  QFont::~QFont((QFont *)&in_RDI[1].childrenBoundingRect.yp);
  QPalette::~QPalette((QPalette *)&in_RDI[1].extras.d.ptr);
  std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::~unique_ptr
            ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)in_RDI);
  QGraphicsItemPrivate::~QGraphicsItemPrivate(in_RDI);
  return;
}

Assistant:

QGraphicsWidgetPrivate::~QGraphicsWidgetPrivate()
{
}